

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha20-poly1305.c
# Opt level: O0

void ccp_free(ssh_cipher *cipher)

{
  ccp_context *ctx;
  ssh_cipher *cipher_local;
  
  smemclr(cipher + -0x31,0x84);
  smemclr((void *)((long)&cipher[-0x21].vt + 4),0x84);
  smemclr(cipher + -0xe,0x58);
  safefree(cipher + -0x31);
  return;
}

Assistant:

static void ccp_free(ssh_cipher *cipher)
{
    struct ccp_context *ctx = container_of(cipher, struct ccp_context, ciph);
    smemclr(&ctx->a_cipher, sizeof(ctx->a_cipher));
    smemclr(&ctx->b_cipher, sizeof(ctx->b_cipher));
    smemclr(&ctx->mac, sizeof(ctx->mac));
    sfree(ctx);
}